

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

bool lsvm::string::equals(string *s1,string *s2)

{
  string *in_RSI;
  string *in_RDI;
  char *s2p;
  char *s1p;
  bool local_29;
  char *local_28;
  char *local_20;
  bool local_1;
  
  if ((in_RDI->size == in_RSI->size) && (in_RDI->count == in_RSI->count)) {
    local_20 = c_str(in_RDI);
    local_28 = c_str(in_RSI);
    for (; *local_20 != '\0'; local_20 = local_20 + 1) {
      if (*local_20 != *local_28) {
        return false;
      }
      local_28 = local_28 + 1;
    }
    local_29 = false;
    if (*local_28 == '\0') {
      local_29 = *local_20 == *local_28;
    }
    local_1 = local_29;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool equals(string* s1, string* s2){
    if(s1->size != s2->size || s1->count != s2->count)
        return false;

    char* s1p = c_str(s1);
    char* s2p = c_str(s2);

    while(*s1p != '\0'){
        if(*s1p != *s2p)
            return false;
        ++s1p; ++s2p;
    }

    return *s2p == '\0' && *s1p == *s2p;
}